

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.h
# Opt level: O0

void __thiscall
KDIS::UTILS::DeadReckoningCalculator::DeadReckoningCalculator
          (DeadReckoningCalculator *this,DeadReckoningCalculator *param_1)

{
  DeadReckoningCalculator *param_1_local;
  DeadReckoningCalculator *this_local;
  
  DATA_TYPE::WorldCoordinates::WorldCoordinates(&this->m_initPosition,&param_1->m_initPosition);
  DATA_TYPE::Vector::Vector(&this->m_initLinearVelocity,&param_1->m_initLinearVelocity);
  DATA_TYPE::Vector::Vector(&this->m_initLinearAcceleration,&param_1->m_initLinearAcceleration);
  DATA_TYPE::Vector::Vector(&this->m_Ab,&param_1->m_Ab);
  this->m_bQuaxAxisSet = (KBOOL)(param_1->m_bQuaxAxisSet & 1);
  DATA_TYPE::Vector::Vector(&this->m_quatAxis,&param_1->m_quatAxis);
  this->m_f64Magnitude = param_1->m_f64Magnitude;
  DATA_TYPE::EulerAngles::EulerAngles(&this->m_initOrientation,&param_1->m_initOrientation);
  DATA_TYPE::EulerAngles::EulerAngles
            (&this->m_initEulerAngularVelocity,&param_1->m_initEulerAngularVelocity);
  memcpy(&this->m_initOrientationMatrix,&param_1->m_initOrientationMatrix,0x48);
  DATA_TYPE::Vector::Vector(&this->m_initAngularVelocity,&param_1->m_initAngularVelocity);
  memcpy(&this->m_wwMatrix,&param_1->m_wwMatrix,0x4c);
  return;
}

Assistant:

class KDIS_EXPORT DeadReckoningCalculator
{
protected:

    KDIS::DATA_TYPE::WorldCoordinates m_initPosition;
    KDIS::DATA_TYPE::Vector m_initLinearVelocity;

    KDIS::DATA_TYPE::Vector m_initLinearAcceleration;
    KDIS::DATA_TYPE::Vector m_Ab;
    KBOOL m_bQuaxAxisSet;
    KDIS::DATA_TYPE::Vector m_quatAxis;

    // Some algorithms are implemented as an integral form for rotation, thus using the time since t0
    KFLOAT32 m_f64Magnitude;

    // Orientation cache
    KDIS::DATA_TYPE::EulerAngles m_initOrientation, m_initEulerAngularVelocity;
    TMATRIX m_initOrientationMatrix, m_initOrientationMatrixTranspose;

    // Angular velocity cache
    KDIS::DATA_TYPE::Vector m_initAngularVelocity;
    TMATRIX m_wwMatrix;
    TMATRIX m_SkewOmegaMatrix;

    KDIS::DATA_TYPE::ENUMS::DeadReckoningAlgorithm m_DRA; // The selected dead reckoning algorithm

    void positionReset( const KDIS::DATA_TYPE::WorldCoordinates & Position );
    void orientationReset( const KDIS::DATA_TYPE::EulerAngles & Orientation );
    void angularVelocityReset( const KDIS::DATA_TYPE::Vector & AngularVelocity );
    void velocityReset( const KDIS::DATA_TYPE::Vector & LinearVelocity );
    void accelerationReset( const KDIS::DATA_TYPE::Vector & LinearAcceleration );
    void quatAxisReset(const KDIS::DATA_TYPE::Vector & QuatAxis);

    KDIS::DATA_TYPE::EulerAngles toEulerAngularVelocity( const KDIS::DATA_TYPE::Vector & angVel, const KDIS::DATA_TYPE::EulerAngles & Orientation );

    void calcOrientation_simplified( KDIS::DATA_TYPE::EulerAngles & OrientationOut, const KFLOAT32 DeltaTime );
    void calcOrientation( KDIS::DATA_TYPE::EulerAngles & OrientationOut, const KFLOAT32 totalTimeSinceReset  );

    void computeRotationAxis( const TMATRIX& curOrientationMatrix );
    void computeDRMatrix( TMATRIX & res, const KFLOAT32 totalTimeSinceReset  );
    void computeDRMatrix_asQuat( TMATRIX & res, const KFLOAT32 totalTimeSinceReset  );

    /************************************************************************/
    /* Dead Reckoning Algorithm Implementations                             */
    /************************************************************************/

    // FPW //
    void calcDeadReckoningFPW( KDIS::DATA_TYPE::WorldCoordinates & PositionOut, const KFLOAT32 totalTimeSinceReset);

    // RPW //
    void calcDeadReckoningRPW( KDIS::DATA_TYPE::WorldCoordinates & PositionOut, KDIS::DATA_TYPE::EulerAngles & OrientationOut, const KFLOAT32 totalTimeSinceReset );

    // RVW //
    void calcDeadReckoningRVW( KDIS::DATA_TYPE::WorldCoordinates & PositionOut,KDIS::DATA_TYPE::EulerAngles & OrientationOut, const KFLOAT32 totalTimeSinceReset );

    // FVW //
    void calcDeadReckoningFVW( KDIS::DATA_TYPE::WorldCoordinates & PositionOut, const KFLOAT32 totalTimeSinceReset );

    // FPB //
    void calcDeadReckoningFPB( KDIS::DATA_TYPE::WorldCoordinates & PositionOut, const KFLOAT32 totalTimeSinceReset);

    // RPB //
    void calcDeadReckoningRPB( KDIS::DATA_TYPE::WorldCoordinates & PositionOut, KDIS::DATA_TYPE::EulerAngles & OrientationOut, const KFLOAT32 totalTimeSinceReset );

    // RVB //
    void calcDeadReckoningRVB( KDIS::DATA_TYPE::WorldCoordinates & PositionOut, KDIS::DATA_TYPE::EulerAngles & OrientationOut, const KFLOAT32 totalTimeSinceReset );

    // FVB //
    void calcDeadReckoningFVB( KDIS::DATA_TYPE::WorldCoordinates & PositionOut, const KFLOAT32 totalTimeSinceReset );

public:

    DeadReckoningCalculator();

    ~DeadReckoningCalculator();

    //************************************
    // FullName:    KDIS::UTILS::DeadReckoningCalculator::Reset
    // Author:      Robert Ioiart - 04/05/2010
    // Description: Resets this object. For a local entity should be called before sending out
    //              an entity state PDU so the local entity can dead-reckon itself.
    //              For a remote entity should be called when an ES PDU is received.
    // Parameter:   const Vector & LinearVelocity
    // Parameter:   const Vector & LinearAcceleration
    // Parameter:   const Vector & AngularVelocity - Angular velocity around the DIS body axes.
    // Parameter:   const WorldCoordinates & Position
    // Parameter:   const EulerAngles & Orientation
    // Parameter:   DeadReckoningAlgorithm DRA
    //************************************
    void Reset( const KDIS::DATA_TYPE::Vector & LinearVelocity, const KDIS::DATA_TYPE::Vector & LinearAcceleration, const KDIS::DATA_TYPE::Vector & AngularVelocity,
                const KDIS::DATA_TYPE::WorldCoordinates & Position, const KDIS::DATA_TYPE::EulerAngles & Orientation, const KDIS::DATA_TYPE::Vector & QuatAxis, KDIS::DATA_TYPE::ENUMS::DeadReckoningAlgorithm DRA );

    //************************************
    // FullName:    KDIS::UTILS::DeadReckoningCalculator::RunAlgorithm
    // Author:      Robert Ioiart - 04/05/2010
    // Description: Steps algorithm for a time step, computing the dead-reckoned position and orientation
    //              based on the values provided at the last Reset.
    // Parameter:   const KFLOAT64 TotalTimeSinceReset
    // Parameter:   WorldCoordinates & PositionOut
    // Parameter:   EulerAngles & OrientationOut
    //************************************
    void RunAlgorithm( const KFLOAT32 TotalTimeSinceReset, KDIS::DATA_TYPE::WorldCoordinates & PositionOut, KDIS::DATA_TYPE::EulerAngles & OrientationOut );

    //************************************
    // FullName:    KDIS::DeadReckoningCalculator::GenerateSmoothingPoints
    // Description: When a new update of position is received from another entity, a correction
    //              in position is usually required so that the entity may be depicted in simulation
    //              as accurately as possible.
    //              The preferred method is to gradually correct the position of the entity over a period of time.
    //              This is called smoothing, this function will generate the smoothing points for you.
    // Parameter:   const WorldCoordinates & StartPosition,
    // Parameter:   const WorldCoordinates & EndPosition,
    // Parameter:   KUINT32 NumberOfPoints
    //************************************
    std::vector<KDIS::DATA_TYPE::WorldCoordinates> GenerateSmoothingPoints( const KDIS::DATA_TYPE::WorldCoordinates & StartPosition, const KDIS::DATA_TYPE::WorldCoordinates & EndPosition, KUINT32 NumberOfPoints );

    //************************************
    // FullName:    KDIS::DeadReckoningCalculator::GenerateSmoothingPoints
    // Description: When a new update of position is received from another entity, a correction
    //              in position is usually required so that the entity may be depicted in simulation
    //              as accurately as possible.
    //              The preferred method is to gradually correct the position of the entity over a period of time.
    //              This is called smoothing, this function will generate the smoothing points for you.
    //
    // Note:        This is the preferred version for generating smoothing points, because it does not
    //              incur the cost of a copy of the vector.
    //
    // Parameter:   const WorldCoordinates & StartPosition,
    // Parameter:   const WorldCoordinates & EndPosition,
    // Parameter:   KUINT32 NumberOfPoints
    // Parameter:   vector<WorldCoordinates> & v
    //************************************
    void GenerateSmoothingPoints( const KDIS::DATA_TYPE::WorldCoordinates & StartPosition, const KDIS::DATA_TYPE::WorldCoordinates & EndPosition, KUINT32 NumberOfPoints, std::vector<KDIS::DATA_TYPE::WorldCoordinates> & v );
}